

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::anon_unknown_0::SetTwiceTest::iterate(SetTwiceTest *this)

{
  TestLog *log;
  deUint32 dVar1;
  EGLBoolean EVar2;
  Library *egl;
  allocator<char> local_9e;
  allocator<char> local_9d;
  int bufferAge;
  ScopedLogSection local_98;
  CallLogWrapper wrapper;
  EGLint damageRegion [4];
  string local_60;
  string local_40;
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&wrapper,egl,log);
  bufferAge = -1;
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  damageRegion[2] = 10;
  damageRegion[3] = 10;
  wrapper.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Test4",&local_9d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"If call setDamageRegion() twice --> EGL_BAD_ACCESS",&local_9e);
  tcu::ScopedLogSection::ScopedLogSection(&local_98,log,&local_40,&local_60);
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x19a);
  (*egl->_vptr_Library[0x2b])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&bufferAge);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,"querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x19b);
  EVar2 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
  NegativePartialUpdateTest::expectTrue(&this->super_NegativePartialUpdateTest,EVar2);
  EVar2 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    (&wrapper,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                     (this->super_NegativePartialUpdateTest).m_eglSurface,damageRegion,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar2);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3002);
  eglu::CallLogWrapper::~CallLogWrapper(&wrapper);
  return STOP;
}

Assistant:

TestCase::IterateResult SetTwiceTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	EGLint					damageRegion[]	= { 10, 10, 10, 10 };
	int						bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test4", "If call setDamageRegion() twice --> EGL_BAD_ACCESS");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectTrue(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, DE_LENGTH_OF_ARRAY(damageRegion)/4));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, DE_LENGTH_OF_ARRAY(damageRegion)/4));
		expectError(EGL_BAD_ACCESS);
	}

	return STOP;
}